

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O0

void yin_print_open(lyout *out,int level,char *elem_prefix,char *elem_name,char *attr_name,
                   char *attr_value,int endflag)

{
  char *format;
  char *local_48;
  char *attr_value_local;
  char *attr_name_local;
  char *elem_name_local;
  char *elem_prefix_local;
  int level_local;
  lyout *out_local;
  
  if (elem_prefix == (char *)0x0) {
    ly_print(out,"%*s<%s",(ulong)(uint)(level << 1),"",elem_name);
  }
  else {
    ly_print(out,"%*s<%s:%s",(ulong)(uint)(level << 1),"",elem_prefix,elem_name);
  }
  if (attr_name == (char *)0x0) {
    if (endflag != 0) {
      format = ">\n";
      if (endflag == -1) {
        format = "/>\n";
      }
      ly_print(out,format);
    }
  }
  else {
    ly_print(out," %s=\"",attr_name);
    lyxml_dump_text(out,attr_value);
    if (endflag == -1) {
      local_48 = "/>\n";
    }
    else {
      local_48 = "";
      if (endflag == 1) {
        local_48 = ">\n";
      }
    }
    ly_print(out,"\"%s",local_48);
  }
  return;
}

Assistant:

static void
yin_print_open(struct lyout *out, int level, const char *elem_prefix, const char *elem_name,
               const char *attr_name, const char *attr_value, int endflag)
{
    if (elem_prefix) {
        ly_print(out, "%*s<%s:%s", LEVEL, INDENT, elem_prefix, elem_name);
    } else {
        ly_print(out, "%*s<%s", LEVEL, INDENT, elem_name);
    }

    if (attr_name) {
        ly_print(out, " %s=\"", attr_name);
        lyxml_dump_text(out, attr_value);
        ly_print(out, "\"%s", endflag == -1 ? "/>\n" : endflag == 1 ? ">\n" : "");
    } else if (endflag) {
        ly_print(out, endflag == -1 ? "/>\n" : ">\n");
    }
}